

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_CreateWithFourConstructorArguments_Test::
~ArenaTest_CreateWithFourConstructorArguments_Test
          (ArenaTest_CreateWithFourConstructorArguments_Test *this)

{
  ArenaTest_CreateWithFourConstructorArguments_Test *this_local;
  
  ~ArenaTest_CreateWithFourConstructorArguments_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, CreateWithFourConstructorArguments) {
  Arena arena;
  const std::string three("3");
  const PleaseDontCopyMe four(4);
  const MustBeConstructedWithOneThroughFour* new_object =
      Arena::Create<MustBeConstructedWithOneThroughFour>(&arena, 1, "2", three,
                                                         &four);
  EXPECT_TRUE(new_object != nullptr);
  ASSERT_EQ(1, new_object->one_);
  ASSERT_STREQ("2", new_object->two_);
  ASSERT_EQ("3", new_object->three_);
  ASSERT_EQ(4, new_object->four_->value());
}